

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorPool::TryFindExtensionInFallbackDatabase
          (DescriptorPool *this,Descriptor *containing_type,int field_number)

{
  Tables *pTVar1;
  int iVar2;
  const_iterator cVar3;
  FileDescriptor *pFVar4;
  bool bVar5;
  FileDescriptorProto file_proto;
  pointer local_100;
  FileDescriptorProto local_f8;
  
  if (this->fallback_database_ == (DescriptorDatabase *)0x0) {
    return false;
  }
  FileDescriptorProto::FileDescriptorProto(&local_f8);
  iVar2 = (*this->fallback_database_->_vptr_DescriptorDatabase[4])
                    (this->fallback_database_,*(undefined8 *)(containing_type + 8),
                     (ulong)(uint)field_number,&local_f8);
  if ((char)iVar2 != '\0') {
    pTVar1 = (this->tables_).ptr_;
    if (pTVar1 == (Tables *)0x0) {
      __assert_fail("ptr_ != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                    ,0x5f,
                    "C *google::protobuf::internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->() const [C = google::protobuf::DescriptorPool::Tables]"
                   );
    }
    local_100 = ((local_f8.name_.ptr_)->_M_dataplus)._M_p;
    cVar3 = std::
            _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&pTVar1->files_by_name_,&local_100);
    if ((cVar3.
         super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
         ._M_cur == (__node_type *)0x0) ||
       (*(long *)((long)cVar3.
                        super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
                        ._M_cur + 0x10) == 0)) {
      pFVar4 = BuildFileFromDatabase(this,&local_f8);
      bVar5 = pFVar4 != (FileDescriptor *)0x0;
      goto LAB_002d5707;
    }
  }
  bVar5 = false;
LAB_002d5707:
  FileDescriptorProto::~FileDescriptorProto(&local_f8);
  return bVar5;
}

Assistant:

bool DescriptorPool::TryFindExtensionInFallbackDatabase(
    const Descriptor* containing_type, int field_number) const {
  if (fallback_database_ == NULL) return false;

  FileDescriptorProto file_proto;
  if (!fallback_database_->FindFileContainingExtension(
        containing_type->full_name(), field_number, &file_proto)) {
    return false;
  }

  if (tables_->FindFile(file_proto.name()) != NULL) {
    // We've already loaded this file, and it apparently doesn't contain the
    // extension we're looking for.  Some DescriptorDatabases return false
    // positives.
    return false;
  }

  if (BuildFileFromDatabase(file_proto) == NULL) {
    return false;
  }

  return true;
}